

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O3

int get_monster_id(char *s,char c)

{
  char *__s2;
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  
  if (c == '\0') {
    iVar1 = 0;
  }
  else {
    iVar1 = def_char_to_monclass(c);
    lVar3 = 0xffffffff;
    if (iVar1 == 0x3d) goto LAB_0010d32a;
  }
  pcVar4 = &mons[0].mlet;
  lVar3 = 0;
  do {
    if (((iVar1 == 0) || (iVar1 == *pcVar4)) &&
       (iVar2 = strcmp(s,((permonst *)(pcVar4 + -8))->mname), iVar2 == 0)) goto LAB_0010d32a;
    lVar3 = lVar3 + 1;
    pcVar4 = pcVar4 + 0x40;
  } while (lVar3 != 0x193);
  pcVar4 = &mons[0].mlet;
  lVar3 = 0;
  do {
    if ((iVar1 == 0) || (iVar1 == *pcVar4)) {
      __s2 = ((permonst *)(pcVar4 + -8))->mname;
      iVar2 = strcasecmp(s,__s2);
      if (iVar2 == 0) {
        if (be_verbose != 0) {
          lc_warning("Monster type \"%s\" matches \"%s\".",s,__s2);
        }
        goto LAB_0010d32a;
      }
    }
    lVar3 = lVar3 + 1;
    pcVar4 = pcVar4 + 0x40;
  } while (lVar3 != 0x193);
  lVar3 = 0xffffffff;
LAB_0010d32a:
  return (int)lVar3;
}

Assistant:

int get_monster_id(char *s, char c)
{
	int i, class;

	class = c ? def_char_to_monclass(c) : 0;
	if (class == MAXMCLASSES) return ERR;

	for (i = LOW_PM; i < NUMMONS; i++)
	    if (!class || class == mons[i].mlet)
		if (!strcmp(s, mons[i].mname)) return i;
	/* didn't find it; lets try case insensitive search */
	for (i = LOW_PM; i < NUMMONS; i++) {
	    if (!class || class == mons[i].mlet) {
		if (!strcasecmp(s, mons[i].mname)) {
		    if (be_verbose)
			lc_warning("Monster type \"%s\" matches \"%s\".",
				   s, mons[i].mname);
		    return i;
		}
	    }
	}
	return ERR;
}